

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svggeometryelement.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGPolyElement::SVGPolyElement(SVGPolyElement *this,Document *document,ElementID id)

{
  ElementID id_local;
  Document *document_local;
  SVGPolyElement *this_local;
  
  SVGGeometryElement::SVGGeometryElement(&this->super_SVGGeometryElement,document,id);
  (this->super_SVGGeometryElement).super_SVGGraphicsElement.super_SVGElement.super_SVGNode.
  _vptr_SVGNode = (_func_int **)&PTR__SVGPolyElement_001c2738;
  SVGPointList::SVGPointList(&this->m_points,Points);
  SVGElement::addProperty((SVGElement *)this,&(this->m_points).super_SVGProperty);
  return;
}

Assistant:

SVGPolyElement::SVGPolyElement(Document* document, ElementID id)
    : SVGGeometryElement(document, id)
    , m_points(PropertyID::Points)
{
    addProperty(m_points);
}